

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrame.h
# Opt level: O3

void __thiscall chrono::ChFrame<double>::ChFrame(ChFrame<double> *this,ChCoordsys<double> *mc)

{
  this->_vptr_ChFrame = (_func_int **)&PTR__ChFrame_0017db90;
  (this->coord).pos.m_data[0] = (mc->pos).m_data[0];
  (this->coord).pos.m_data[1] = (mc->pos).m_data[1];
  (this->coord).pos.m_data[2] = (mc->pos).m_data[2];
  (this->coord).rot.m_data[0] = (mc->rot).m_data[0];
  (this->coord).rot.m_data[1] = (mc->rot).m_data[1];
  (this->coord).rot.m_data[2] = (mc->rot).m_data[2];
  (this->coord).rot.m_data[3] = (mc->rot).m_data[3];
  ChMatrix33<double>::ChMatrix33(&this->Amatrix,&mc->rot);
  return;
}

Assistant:

explicit ChFrame(const ChCoordsys<Real>& mc) : coord(mc), Amatrix(mc.rot) {}